

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reactive_socket_recvfrom_op.hpp
# Opt level: O0

status asio::detail::
       reactive_socket_recvfrom_op_base<asio::mutable_buffers_1,_asio::ip::basic_endpoint<asio::ip::udp>_>
       ::do_perform(reactor_op *base)

{
  bool bVar1;
  size_t *addrlen;
  basic_endpoint<asio::ip::udp> *this;
  void *in_RDI;
  size_t new_size;
  size_t unaff_retaddr;
  void *in_stack_00000008;
  socket_type in_stack_00000010;
  error_code *in_stack_00000020;
  size_t *in_stack_00000028;
  status result;
  size_t addr_len;
  reactive_socket_recvfrom_op_base<asio::mutable_buffers_1,_asio::ip::basic_endpoint<asio::ip::udp>_>
  *o;
  mutable_buffer local_40;
  mutable_buffer local_30;
  status local_1c;
  void *pvVar2;
  int flags;
  
  pvVar2 = in_RDI;
  addrlen = (size_t *)
            asio::ip::basic_endpoint<asio::ip::udp>::capacity
                      ((basic_endpoint<asio::ip::udp> *)0x208e91);
  flags = (int)((ulong)pvVar2 >> 0x20);
  local_30 = buffer_sequence_adapter<asio::mutable_buffer,_asio::mutable_buffers_1>::first
                       ((mutable_buffers_1 *)((long)in_RDI + 0x48));
  mutable_buffer::data((mutable_buffer *)&local_30);
  local_40 = buffer_sequence_adapter<asio::mutable_buffer,_asio::mutable_buffers_1>::first
                       ((mutable_buffers_1 *)((long)in_RDI + 0x48));
  mutable_buffer::size((mutable_buffer *)&local_40);
  asio::ip::basic_endpoint<asio::ip::udp>::data((basic_endpoint<asio::ip::udp> *)0x208f0a);
  new_size = (long)in_RDI + 0x18;
  this = (basic_endpoint<asio::ip::udp> *)((long)in_RDI + 0x30);
  bVar1 = socket_ops::non_blocking_recvfrom1
                    (in_stack_00000010,in_stack_00000008,unaff_retaddr,flags,in_RDI,addrlen,
                     in_stack_00000020,in_stack_00000028);
  local_1c = (status)bVar1;
  if ((local_1c != not_done) &&
     (bVar1 = std::error_code::operator_cast_to_bool((error_code *)((long)in_RDI + 0x18)), !bVar1))
  {
    asio::ip::basic_endpoint<asio::ip::udp>::resize(this,new_size);
  }
  return local_1c;
}

Assistant:

static status do_perform(reactor_op* base)
  {
    ASIO_ASSUME(base != 0);
    reactive_socket_recvfrom_op_base* o(
        static_cast<reactive_socket_recvfrom_op_base*>(base));

    typedef buffer_sequence_adapter<asio::mutable_buffer,
        MutableBufferSequence> bufs_type;

    std::size_t addr_len = o->sender_endpoint_.capacity();
    status result;
    if (bufs_type::is_single_buffer)
    {
      result = socket_ops::non_blocking_recvfrom1(
          o->socket_, bufs_type::first(o->buffers_).data(),
          bufs_type::first(o->buffers_).size(), o->flags_,
          o->sender_endpoint_.data(), &addr_len,
          o->ec_, o->bytes_transferred_) ? done : not_done;
    }
    else
    {
      bufs_type bufs(o->buffers_);
      result = socket_ops::non_blocking_recvfrom(o->socket_,
          bufs.buffers(), bufs.count(), o->flags_,
          o->sender_endpoint_.data(), &addr_len,
          o->ec_, o->bytes_transferred_) ? done : not_done;
    }

    if (result && !o->ec_)
      o->sender_endpoint_.resize(addr_len);

    ASIO_HANDLER_REACTOR_OPERATION((*o, "non_blocking_recvfrom",
          o->ec_, o->bytes_transferred_));

    return result;
  }